

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O0

bool __thiscall
duckdb::CatalogSet::DropDependencies
          (CatalogSet *this,CatalogTransaction transaction,string *name,bool cascade,
          bool allow_drop_internal)

{
  CatalogTransaction transaction_00;
  bool bVar1;
  CatalogEntry *pCVar2;
  undefined8 uVar3;
  DuckCatalog *pDVar4;
  byte in_CL;
  byte cascade_00;
  byte in_DL;
  CatalogEntry *in_RSI;
  DependencyManager *in_RDI;
  CatalogTransaction in_stack_00000000;
  DuckCatalog *duck_catalog;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  CatalogSet *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 in_stack_ffffffffffffff58 [32];
  allocator local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  Catalog *pCStack_48;
  CatalogEntry *local_28;
  byte local_1a;
  bool local_1;
  
  cascade_00 = in_DL & 1;
  local_1a = in_CL & 1;
  memcpy(local_50,&stack0x00000008,0x28);
  transaction_00.db.ptr._7_1_ = in_stack_ffffffffffffff57;
  transaction_00.db.ptr._0_7_ = in_stack_ffffffffffffff50;
  transaction_00.context.ptr = (ClientContext *)in_stack_ffffffffffffff58._0_8_;
  transaction_00.transaction.ptr = (Transaction *)in_stack_ffffffffffffff58._8_8_;
  transaction_00.transaction_id = in_stack_ffffffffffffff58._16_8_;
  transaction_00.start_time = in_stack_ffffffffffffff58._24_8_;
  local_28 = (CatalogEntry *)
             GetEntry(in_stack_ffffffffffffff38,transaction_00,in_stack_ffffffffffffff30);
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_28);
  if (bVar1) {
    pCVar2 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                       ((optional_ptr<duckdb::CatalogEntry,_true> *)pCStack_48);
    if (((pCVar2->internal & 1U) != 0) && ((local_1a & 1) == 0)) {
      uVar3 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_70,"Cannot drop entry \"%s\" because it is an internal system entry",
                 &local_71);
      pCVar2 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                         ((optional_ptr<duckdb::CatalogEntry,_true> *)pCStack_48);
      ::std::__cxx11::string::string((string *)&stack0xffffffffffffff58,(string *)&pCVar2->name);
      CatalogException::CatalogException<std::__cxx11::string>
                ((CatalogException *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 in_stack_ffffffffffffff20);
      __cxa_throw(uVar3,&CatalogException::typeinfo,CatalogException::~CatalogException);
    }
    pCVar2 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                       ((optional_ptr<duckdb::CatalogEntry,_true> *)pCStack_48);
    (*pCVar2->_vptr_CatalogEntry[0xb])();
    pDVar4 = Catalog::Cast<duckdb::DuckCatalog>(pCStack_48);
    (*(pDVar4->super_Catalog)._vptr_Catalog[0x1a])();
    optional_ptr<duckdb::DependencyManager,_true>::operator->
              ((optional_ptr<duckdb::DependencyManager,_true> *)pCStack_48);
    memcpy(local_e8,&stack0x00000008,0x28);
    optional_ptr<duckdb::CatalogEntry,_true>::operator*
              ((optional_ptr<duckdb::CatalogEntry,_true> *)pCStack_48);
    DependencyManager::DropObject(in_RDI,in_stack_00000000,in_RSI,(bool)cascade_00);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CatalogSet::DropDependencies(CatalogTransaction transaction, const string &name, bool cascade,
                                  bool allow_drop_internal) {
	auto entry = GetEntry(transaction, name);
	if (!entry) {
		return false;
	}
	if (entry->internal && !allow_drop_internal) {
		throw CatalogException("Cannot drop entry \"%s\" because it is an internal system entry", entry->name);
	}
	// check any dependencies of this object
	D_ASSERT(entry->ParentCatalog().IsDuckCatalog());
	auto &duck_catalog = entry->ParentCatalog().Cast<DuckCatalog>();
	duck_catalog.GetDependencyManager()->DropObject(transaction, *entry, cascade);
	return true;
}